

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveRedundantMaterials.cpp
# Opt level: O0

void __thiscall
Assimp::RemoveRedundantMatsProcess::SetupProperties(RemoveRedundantMatsProcess *this,Importer *pImp)

{
  allocator local_59;
  string local_58;
  string local_38;
  Importer *local_18;
  Importer *pImp_local;
  RemoveRedundantMatsProcess *this_local;
  
  local_18 = pImp;
  pImp_local = (Importer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"",&local_59);
  Importer::GetPropertyString(&local_38,pImp,"PP_RRM_EXCLUDE_LIST",&local_58);
  std::__cxx11::string::operator=((string *)&this->mConfigFixedMaterials,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void RemoveRedundantMatsProcess::SetupProperties(const Importer* pImp)
{
    // Get value of AI_CONFIG_PP_RRM_EXCLUDE_LIST
    mConfigFixedMaterials = pImp->GetPropertyString(AI_CONFIG_PP_RRM_EXCLUDE_LIST,"");
}